

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O2

Expr * __thiscall SQCompilation::SQParser::LogicalAndExp(SQParser *this)

{
  BinExpr *args_1;
  Expr *args_2;
  NestingChecker nc;
  
  NestingChecker::NestingChecker(&nc,this);
  args_1 = (BinExpr *)BitwiseOrExp(this);
  NestingChecker::inc(&nc);
  if (this->_token == 0x10e) {
    Lex(this);
    args_2 = LogicalAndExp(this);
    args_1 = newNode<SQCompilation::BinExpr,TreeOp,SQCompilation::Expr*,SQCompilation::Expr*>
                       (this,TO_ANDAND,(Expr *)args_1,args_2);
  }
  (nc._p)->_depth = (nc._p)->_depth - nc._depth;
  return &args_1->super_Expr;
}

Assistant:

Expr* SQParser::LogicalAndExp()
{
    NestingChecker nc(this);
    Expr *lhs = BitwiseOrExp();
    for (;;) {
        nc.inc();
        switch (_token) {
        case TK_AND: {
            Lex();

            Expr *rhs = LogicalAndExp();
            lhs = newNode<BinExpr>(TO_ANDAND, lhs, rhs);
        }
        default:
            return lhs;
        }
    }
}